

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall glu::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  undefined4 uVar1;
  ValueBlock *pVVar2;
  char *str;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  int local_14c;
  undefined1 local_148 [4];
  int arrayLength;
  undefined1 local_130 [8];
  Value value;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string valueName;
  ValueBlock *pVStack_20;
  DataType basicType;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *dstBlock;
  ValueBlock *valueBlock_local;
  ShaderParser *this_local;
  
  pVStack_20 = (ValueBlock *)0x0;
  valueName.field_2._12_4_ = 0x5e;
  std::__cxx11::string::string(local_48);
  if (this->m_curToken == TOKEN_UNIFORM) {
    pVVar2 = (ValueBlock *)&valueBlock->uniforms;
  }
  else {
    pVVar2 = valueBlock;
    if (this->m_curToken != TOKEN_INPUT) {
      if (this->m_curToken == TOKEN_OUTPUT) {
        pVVar2 = (ValueBlock *)&valueBlock->outputs;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"unexpected token encountered when parsing value classifier",
                   &local_69);
        parseError(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        pVVar2 = pVStack_20;
      }
    }
  }
  pVStack_20 = pVVar2;
  advanceToken(this);
  valueName.field_2._12_4_ = mapDataTypeToken(this,this->m_curToken);
  if (valueName.field_2._12_4_ == TYPE_INVALID) {
    std::operator+(&local_a0,"unexpected token when parsing value data type: ",&this->m_curTokenStr)
    ;
    parseError(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  advanceToken(this);
  if ((this->m_curToken == TOKEN_IDENTIFIER) || (this->m_curToken == TOKEN_STRING)) {
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::operator=(local_48,(string *)&this->m_curTokenStr);
    }
    else {
      str = (char *)std::__cxx11::string::c_str();
      parseStringLiteral_abi_cxx11_(&local_c0,this,str);
      std::__cxx11::string::operator=(local_48,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &value.elements.
                    super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "unexpected token when parsing value name: ",&this->m_curTokenStr);
    parseError(this,(string *)
                    &value.elements.
                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &value.elements.
                super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  advanceToken(this);
  advanceToken(this,TOKEN_ASSIGN);
  Value::Value((Value *)local_130);
  std::__cxx11::string::operator=((string *)((long)&value.type.m_data + 8),local_48);
  VarType::VarType((VarType *)local_148,valueName.field_2._12_4_,PRECISION_LAST);
  VarType::operator=((VarType *)local_130,(VarType *)local_148);
  VarType::~VarType((VarType *)local_148);
  std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::push_back
            (&pVStack_20->inputs,(value_type *)local_130);
  Value::~Value((Value *)local_130);
  uVar1 = valueName.field_2._12_4_;
  if (this->m_curToken == TOKEN_LEFT_BRACKET) {
    local_14c = 0;
    advanceToken(this,TOKEN_LEFT_BRACKET);
    while( true ) {
      uVar1 = valueName.field_2._12_4_;
      pvVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::back
                         (&pVStack_20->inputs);
      parseValueElement(this,uVar1,pvVar3);
      local_14c = local_14c + 1;
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) break;
      if (this->m_curToken == TOKEN_VERTICAL_BAR) {
        advanceToken(this);
      }
      else {
        std::operator+(&local_170,"unexpected token in value element array: ",&this->m_curTokenStr);
        parseError(this,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
    }
    advanceToken(this,TOKEN_RIGHT_BRACKET);
  }
  else {
    pvVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::back(&pVStack_20->inputs)
    ;
    parseValueElement(this,uVar1,pvVar3);
  }
  advanceToken(this,TOKEN_SEMI_COLON);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void ShaderParser::parseValue (ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	vector<Value>*	dstBlock	= DE_NULL;
	DataType		basicType	= TYPE_LAST;
	std::string		valueName;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		dstBlock = &valueBlock.uniforms;
	else if (m_curToken == TOKEN_INPUT)
		dstBlock = &valueBlock.inputs;
	else if (m_curToken == TOKEN_OUTPUT)
		dstBlock = &valueBlock.outputs;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	basicType = mapDataTypeToken(m_curToken);
	if (basicType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			valueName = m_curTokenStr;
		else
			valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	{
		Value value;
		value.name	= valueName;
		value.type	= VarType(basicType, PRECISION_LAST);
		dstBlock->push_back(value);
	}

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		int	arrayLength	= 0; // \todo [2015-08-03 pyry] Currently unused

		advanceToken(TOKEN_LEFT_BRACKET);

		for (;;)
		{
			parseValueElement(basicType, dstBlock->back());
			arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else //  single elements
	{
		parseValueElement(basicType, dstBlock->back());
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration
}